

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_shuffle_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ShiftMixParseVarint64Test_AtOrBelowLimit_Test::
~ShiftMixParseVarint64Test_AtOrBelowLimit_Test(ShiftMixParseVarint64Test_AtOrBelowLimit_Test *this)

{
  ShiftMixParseVarint64Test_AtOrBelowLimit_Test *this_local;
  
  ~ShiftMixParseVarint64Test_AtOrBelowLimit_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ShiftMixParseVarint64Test, AtOrBelowLimit) {
  const int limit = length();

  int64_t res = 0x9897969594939291ULL >> (70 - 7 * limit);
  char data[10];
  int serialized_len = NaiveSerialize(data, res);
  ASSERT_THAT(serialized_len, Eq(limit));

  int64_t result;
  const char* p = ParseWithLimit(limit, data, result);
  ASSERT_THAT(p, testing::NotNull());
  ASSERT_THAT(p - data, Eq(limit));
  ASSERT_THAT(result, Eq(res));
}